

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O3

void on_underlying_io_error(void *context)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  TLS_IO_INSTANCE *tls_io_instance;
  
  if (*(int *)((long)context + 0x68) - 1U < 2) {
    *(undefined4 *)((long)context + 0x68) = 0;
    indicate_open_complete((TLS_IO_INSTANCE *)context,IO_OPEN_ERROR);
    return;
  }
  if (*(int *)((long)context + 0x68) != 4) {
    return;
  }
  if (*(code **)((long)context + 0x20) != (code *)0x0) {
    (**(code **)((long)context + 0x20))(*(undefined8 *)((long)context + 0x40));
    return;
  }
  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
               ,"indicate_error",0x28f,1,"NULL on_io_error.");
    return;
  }
  return;
}

Assistant:

static void on_underlying_io_error(void* context)
{
    SASL_CLIENT_IO_INSTANCE* sasl_client_io_instance = (SASL_CLIENT_IO_INSTANCE*)context;

    switch (sasl_client_io_instance->io_state)
    {
    default:
        LogError("Error callback received in unexpected state");
        break;

    case IO_STATE_OPENING_UNDERLYING_IO:
    case IO_STATE_SASL_HANDSHAKE:
        /* Codes_SRS_SASLCLIENTIO_01_101: [`on_open_complete` with `IO_OPEN_ERROR`]*/
        if (xio_close(sasl_client_io_instance->underlying_io, on_underlying_io_close_complete, sasl_client_io_instance) != 0)
        {
            sasl_client_io_instance->io_state = IO_STATE_NOT_OPEN;
            indicate_open_complete(sasl_client_io_instance, IO_OPEN_ERROR);
        }

        break;

    case IO_STATE_OPEN:
        sasl_client_io_instance->io_state = IO_STATE_ERROR;
        indicate_error(sasl_client_io_instance);
        break;
    }
}